

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  ofstream ppm;
  OutputImage<cert::Color,_120UL,_10UL> local_e18;
  
  std::ofstream::ofstream(&ppm,"output_compiletime.ppm",_S_out);
  poVar1 = std::operator<<((ostream *)&ppm,"P3\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::operator<<(poVar1,"\n255\n");
  get_frame_0();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_1();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_2();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_3();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_4();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_5();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_6();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_7();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_8();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_9();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_10();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  get_frame_11();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>(&ppm,&local_e18);
  std::ofstream::~ofstream(&ppm);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
	std::ofstream ppm ("output_compiletime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, get_frame_0 ());
	print_image (ppm, get_frame_1 ());
	print_image (ppm, get_frame_2 ());
	print_image (ppm, get_frame_3 ());
	print_image (ppm, get_frame_4 ());
	print_image (ppm, get_frame_5 ());
	print_image (ppm, get_frame_6 ());
	print_image (ppm, get_frame_7 ());
	print_image (ppm, get_frame_8 ());
	print_image (ppm, get_frame_9 ());
	print_image (ppm, get_frame_10 ());
	print_image (ppm, get_frame_11 ());
}